

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::type_is_block_like(Compiler *this,SPIRType *type)

{
  bool bVar1;
  ParsedIR *this_00;
  uint32_t i;
  uint index;
  bool bVar2;
  
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    this_00 = &this->ir;
    bVar1 = ParsedIR::has_decoration(this_00,(ID)(type->super_IVariant).self.id,DecorationBlock);
    bVar2 = true;
    if ((!bVar1) &&
       (bVar1 = ParsedIR::has_decoration
                          (this_00,(ID)(type->super_IVariant).self.id,DecorationBufferBlock), !bVar1
       )) {
      index = 0;
      do {
        bVar2 = index < (uint)(type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                              buffer_size;
        if (!bVar2) {
          return bVar2;
        }
        bVar1 = ParsedIR::has_member_decoration
                          (this_00,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset);
        index = index + 1;
      } while (!bVar1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Compiler::type_is_block_like(const SPIRType &type) const
{
	if (type.basetype != SPIRType::Struct)
		return false;

	if (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock))
	{
		return true;
	}

	// Block-like types may have Offset decorations.
	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
		if (has_member_decoration(type.self, i, DecorationOffset))
			return true;

	return false;
}